

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylinderShape.h
# Opt level: O1

cbtScalar __thiscall cbtCylinderShapeZ::getRadius(cbtCylinderShapeZ *this)

{
  float fVar1;
  float fVar2;
  
  fVar1 = (this->super_cbtCylinderShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.
          m_floats[0];
  fVar2 = fVar1;
  (*(this->super_cbtCylinderShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  (*(this->super_cbtCylinderShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  (*(this->super_cbtCylinderShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  return fVar2 + fVar1;
}

Assistant:

virtual cbtScalar getRadius() const
	{
		return getHalfExtentsWithMargin().getX();
	}